

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_27b883::PeerManagerImpl::UpdatedBlockTip
          (PeerManagerImpl *this,CBlockIndex *pindexNew,CBlockIndex *pindexFork,
          bool fInitialDownload)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  _Base_ptr p_Var3;
  iterator __position;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  pointer puVar7;
  uint256 *puVar8;
  _Base_ptr p_Var9;
  undefined7 in_register_00000009;
  uint256 *hash;
  uint256 *puVar10;
  long in_FS_OFFSET;
  vector<uint256,_std::allocator<uint256>_> vHashes;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock45;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock44;
  vector<uint256,_std::allocator<uint256>_> local_88;
  unique_lock<std::mutex> local_68;
  uint256 local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = pindexNew->nTime;
  LOCK();
  (this->m_best_height).super___atomic_base<int>._M_i = pindexNew->nHeight;
  UNLOCK();
  LOCK();
  (this->m_best_block_time)._M_i.__r = (ulong)uVar2;
  UNLOCK();
  if ((int)CONCAT71(in_register_00000009,fInitialDownload) == 0) {
    local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_start = (uint256 *)0x0;
    local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_finish = (uint256 *)0x0;
    local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (uint256 *)0x0;
    puVar8 = (uint256 *)0x0;
    do {
      if (pindexNew == pindexFork) break;
      puVar10 = pindexNew->phashBlock;
      if (puVar10 == (uint256 *)0x0) {
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      local_58.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(puVar10->super_base_blob<256U>).m_data._M_elems;
      local_58.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((puVar10->super_base_blob<256U>).m_data._M_elems + 8);
      local_58.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((puVar10->super_base_blob<256U>).m_data._M_elems + 0x10);
      local_58.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((puVar10->super_base_blob<256U>).m_data._M_elems + 0x18);
      if (local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<uint256,_std::allocator<uint256>_>::_M_realloc_insert<uint256>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_58);
        puVar8 = local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      else {
        uVar4 = *(undefined8 *)(puVar10->super_base_blob<256U>).m_data._M_elems;
        uVar5 = *(undefined8 *)((puVar10->super_base_blob<256U>).m_data._M_elems + 8);
        uVar6 = *(undefined8 *)((puVar10->super_base_blob<256U>).m_data._M_elems + 0x18);
        *(undefined8 *)
         (((local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 0x10) =
             *(undefined8 *)((puVar10->super_base_blob<256U>).m_data._M_elems + 0x10);
        *(undefined8 *)
         (((local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 0x18) =
             uVar6;
        *(undefined8 *)
         ((local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems = uVar4;
        *(undefined8 *)
         (((local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 8) = uVar5;
        local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      pindexNew = pindexNew->pprev;
    } while ((long)local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar8 != 0x100);
    local_58.super_base_blob<256U>.m_data._M_elems._0_8_ = &this->m_peer_mutex;
    local_58.super_base_blob<256U>.m_data._M_elems._8_8_ =
         local_58.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_58);
    p_Var9 = (this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->m_peer_map)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var9 != p_Var1) {
      do {
        p_Var3 = p_Var9[1]._M_parent;
        local_68._M_device = (mutex_type *)&p_Var3[2]._M_parent;
        local_68._M_owns = false;
        std::unique_lock<std::mutex>::lock(&local_68);
        puVar7 = local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start) {
          puVar8 = local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          do {
            puVar10 = puVar8 + -1;
            __position._M_current = (uint256 *)p_Var3[4]._M_left;
            if ((_Base_ptr)__position._M_current == p_Var3[4]._M_right) {
              std::vector<uint256,std::allocator<uint256>>::_M_realloc_insert<uint256_const&>
                        ((vector<uint256,std::allocator<uint256>> *)&p_Var3[4]._M_parent,__position,
                         puVar10);
            }
            else {
              uVar4 = *(undefined8 *)(puVar10->super_base_blob<256U>).m_data._M_elems;
              uVar5 = *(undefined8 *)(puVar8[-1].super_base_blob<256U>.m_data._M_elems + 8);
              uVar6 = *(undefined8 *)(puVar8[-1].super_base_blob<256U>.m_data._M_elems + 0x18);
              *(undefined8 *)
               (((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 0x10) =
                   *(undefined8 *)(puVar8[-1].super_base_blob<256U>.m_data._M_elems + 0x10);
              *(undefined8 *)
               (((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 0x18) = uVar6;
              *(undefined8 *)((__position._M_current)->super_base_blob<256U>).m_data._M_elems =
                   uVar4;
              *(undefined8 *)(((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 8)
                   = uVar5;
              p_Var3[4]._M_left = p_Var3[4]._M_left + 1;
            }
            puVar8 = puVar10;
          } while (puVar10 != puVar7);
        }
        std::unique_lock<std::mutex>::~unique_lock(&local_68);
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != p_Var1);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_58);
    CConnman::WakeMessageHandler(this->m_connman);
    if (local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start != (uint256 *)0x0) {
      operator_delete(local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::UpdatedBlockTip(const CBlockIndex *pindexNew, const CBlockIndex *pindexFork, bool fInitialDownload)
{
    SetBestBlock(pindexNew->nHeight, std::chrono::seconds{pindexNew->GetBlockTime()});

    // Don't relay inventory during initial block download.
    if (fInitialDownload) return;

    // Find the hashes of all blocks that weren't previously in the best chain.
    std::vector<uint256> vHashes;
    const CBlockIndex *pindexToAnnounce = pindexNew;
    while (pindexToAnnounce != pindexFork) {
        vHashes.push_back(pindexToAnnounce->GetBlockHash());
        pindexToAnnounce = pindexToAnnounce->pprev;
        if (vHashes.size() == MAX_BLOCKS_TO_ANNOUNCE) {
            // Limit announcements in case of a huge reorganization.
            // Rely on the peer's synchronization mechanism in that case.
            break;
        }
    }

    {
        LOCK(m_peer_mutex);
        for (auto& it : m_peer_map) {
            Peer& peer = *it.second;
            LOCK(peer.m_block_inv_mutex);
            for (const uint256& hash : vHashes | std::views::reverse) {
                peer.m_blocks_for_headers_relay.push_back(hash);
            }
        }
    }

    m_connman.WakeMessageHandler();
}